

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AudioPluginUtil.h
# Opt level: O2

void __thiscall HistoryBuffer::Feed(HistoryBuffer *this,float sample)

{
  int iVar1;
  int iVar2;
  
  iVar1 = this->writeindex + 1;
  iVar2 = 0;
  if (iVar1 != this->length) {
    iVar2 = iVar1;
  }
  this->data[iVar2] = sample;
  this->writeindex = iVar2;
  return;
}

Assistant:

inline void Feed(float sample)
    {
        // Don't try to optimize this with ++
        // The writeindex veriable may be read at the same time, so we don't want intermediate values indexing out of the array.
        int w = writeindex + 1;
        if (w == length)
            w = 0;
        data[w] = sample;
        writeindex = w;
    }